

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O2

void __thiscall Assimp::FindInstancesProcess::Execute(FindInstancesProcess *this,aiScene *pScene)

{
  aiMesh *paVar1;
  aiMesh *this_00;
  aiFace *paVar2;
  bool bVar3;
  uint tt;
  uint uVar4;
  int iVar5;
  Logger *pLVar6;
  uint64_t uVar7;
  uint i;
  uint nn_1;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ai_real aVar13;
  float e;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> remapping;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> hashes;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> ftbl_inst;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> ftbl_orig;
  uint local_1ec;
  _Head_base<0UL,_unsigned_int_*,_false> local_1e0;
  _Head_base<0UL,_unsigned_long_*,_false> local_1d8;
  FindInstancesProcess *local_1d0;
  _Head_base<0UL,_unsigned_int_*,_false> local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  local_1d0 = this;
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"FindInstancesProcess begin");
  uVar10 = (ulong)pScene->mNumMeshes;
  if (uVar10 != 0) {
    local_1d8._M_head_impl = (unsigned_long *)operator_new__(uVar10 * 8);
    local_1e0._M_head_impl = (uint *)operator_new__(uVar10 * 4);
    local_1ec = 0;
    for (uVar11 = 0; uVar11 < uVar10; uVar11 = uVar11 + 1) {
      paVar1 = pScene->mMeshes[uVar11];
      uVar7 = GetMeshHash(paVar1);
      local_1d8._M_head_impl[uVar11] = uVar7;
      aVar13 = ComputePositionEpsilon(paVar1);
      e = aVar13 * aVar13;
      uVar10 = uVar11 & 0xffffffff;
LAB_00141029:
      do {
        do {
          uVar12 = (int)uVar10 - 1;
          uVar10 = (ulong)uVar12;
          if ((int)uVar12 < 0) goto LAB_001412c8;
        } while ((((local_1d8._M_head_impl[uVar11] != local_1d8._M_head_impl[uVar12]) ||
                  (this_00 = pScene->mMeshes[uVar12], this_00 == (aiMesh *)0x0)) ||
                 (this_00->mNumBones != paVar1->mNumBones)) ||
                (((this_00->mNumFaces != paVar1->mNumFaces ||
                  (uVar4 = this_00->mNumVertices, uVar4 != paVar1->mNumVertices)) ||
                 ((this_00->mMaterialIndex != paVar1->mMaterialIndex ||
                  (this_00->mPrimitiveTypes != paVar1->mPrimitiveTypes))))));
        if (uVar4 != 0 && this_00->mVertices != (aiVector3D *)0x0) {
          bVar3 = CompareArrays(this_00->mVertices,paVar1->mVertices,uVar4,e);
          if (!bVar3) goto LAB_00141029;
          uVar4 = this_00->mNumVertices;
        }
        if (uVar4 != 0 && this_00->mNormals != (aiVector3D *)0x0) {
          bVar3 = CompareArrays(this_00->mNormals,paVar1->mNormals,uVar4,e);
          if (!bVar3) goto LAB_00141029;
        }
        bVar3 = aiMesh::HasTangentsAndBitangents(this_00);
        if (bVar3) {
          bVar3 = CompareArrays(this_00->mTangents,paVar1->mTangents,this_00->mNumVertices,e);
          if (!bVar3) goto LAB_00141029;
          bVar3 = CompareArrays(this_00->mBitangents,paVar1->mBitangents,this_00->mNumVertices,e);
          if (!bVar3) goto LAB_00141029;
        }
        uVar4 = aiMesh::GetNumUVChannels(this_00);
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          if (this_00->mTextureCoords[uVar8] != (aiVector3D *)0x0) {
            bVar3 = CompareArrays(this_00->mTextureCoords[uVar8],paVar1->mTextureCoords[uVar8],
                                  this_00->mNumVertices,0.001);
            if (!bVar3) {
              if (uVar4 != (uint)uVar8) goto LAB_00141029;
              break;
            }
          }
        }
        uVar4 = aiMesh::GetNumColorChannels(this_00);
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          if (this_00->mColors[uVar8] != (aiColor4D *)0x0) {
            bVar3 = CompareArrays(this_00->mColors[uVar8],paVar1->mColors[uVar8],
                                  this_00->mNumVertices,0.001);
            if (!bVar3) {
              if (uVar4 != (uint)uVar8) goto LAB_00141029;
              break;
            }
          }
        }
        if (local_1d0->configSpeedFlag != false) break;
        bVar3 = CompareBones(this_00,paVar1);
        if (!bVar3) goto LAB_00141029;
        local_1a8._0_8_ = operator_new__((ulong)this_00->mNumVertices << 2);
        local_1c8[0]._M_head_impl = (uint *)operator_new__((ulong)this_00->mNumVertices << 2);
        for (uVar8 = 0; uVar8 < this_00->mNumFaces; uVar8 = uVar8 + 1) {
          paVar2 = this_00->mFaces;
          for (uVar9 = 0; uVar9 < paVar2[uVar8].mNumIndices; uVar9 = uVar9 + 1) {
            *(uint *)(local_1a8._0_8_ + (ulong)paVar2[uVar8].mIndices[uVar9] * 4) = (uint)uVar8;
          }
          paVar2 = paVar1->mFaces;
          for (uVar9 = 0; uVar9 < paVar2[uVar8].mNumIndices; uVar9 = uVar9 + 1) {
            local_1c8[0]._M_head_impl[paVar2[uVar8].mIndices[uVar9]] = (uint)uVar8;
          }
        }
        iVar5 = bcmp(local_1c8[0]._M_head_impl,(void *)local_1a8._0_8_,
                     (ulong)this_00->mNumVertices << 2);
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)local_1c8);
        std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&local_1a8);
      } while (iVar5 != 0);
      local_1e0._M_head_impl[uVar11] = local_1e0._M_head_impl[uVar12];
      aiMesh::~aiMesh(paVar1);
      operator_delete(paVar1);
      pScene->mMeshes[uVar11] = (aiMesh *)0x0;
LAB_001412c8:
      if (pScene->mMeshes[uVar11] != (aiMesh *)0x0) {
        local_1e0._M_head_impl[uVar11] = local_1ec;
        local_1ec = local_1ec + 1;
      }
      uVar10 = (ulong)pScene->mNumMeshes;
    }
    if (local_1ec == 0) {
      __assert_fail("0 != numMeshesOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/FindInstancesProcess.cpp"
                    ,0x100,"virtual void Assimp::FindInstancesProcess::Execute(aiScene *)");
    }
    if (local_1ec == (uint)uVar10) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"FindInstancesProcess finished. No instanced meshes found");
    }
    else {
      uVar12 = 0;
      uVar4 = 0;
      while (uVar12 < local_1ec) {
        paVar1 = pScene->mMeshes[uVar4];
        if (paVar1 != (aiMesh *)0x0) {
          uVar10 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
          pScene->mMeshes[uVar10] = paVar1;
        }
        uVar4 = uVar4 + 1;
      }
      UpdateMeshIndices(pScene->mRootNode,local_1e0._M_head_impl);
      bVar3 = DefaultLogger::isNullLogger();
      if (!bVar3) {
        pLVar6 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[38]>(&local_1a8,(char (*) [38])"FindInstancesProcess finished. Found ")
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<((ostream *)&local_1a8," instances");
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar6,(char *)local_1c8[0]._M_head_impl);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      pScene->mNumMeshes = local_1ec;
    }
    std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
              ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&local_1e0);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_1d8);
  }
  return;
}

Assistant:

void FindInstancesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FindInstancesProcess begin");
    if (pScene->mNumMeshes) {

        // use a pseudo hash for all meshes in the scene to quickly find
        // the ones which are possibly equal. This step is executed early
        // in the pipeline, so we could, depending on the file format,
        // have several thousand small meshes. That's too much for a brute
        // everyone-against-everyone check involving up to 10 comparisons
        // each.
        std::unique_ptr<uint64_t[]> hashes (new uint64_t[pScene->mNumMeshes]);
        std::unique_ptr<unsigned int[]> remapping (new unsigned int[pScene->mNumMeshes]);

        unsigned int numMeshesOut = 0;
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

            aiMesh* inst = pScene->mMeshes[i];
            hashes[i] = GetMeshHash(inst);

            // Find an appropriate epsilon 
            // to compare position differences against
            float epsilon = ComputePositionEpsilon(inst);
            epsilon *= epsilon;

            for (int a = i-1; a >= 0; --a) {
                if (hashes[i] == hashes[a])
                {
                    aiMesh* orig = pScene->mMeshes[a];
                    if (!orig)
                        continue;

                    // check for hash collision .. we needn't check
                    // the vertex format, it *must* match due to the
                    // (brilliant) construction of the hash
                    if (orig->mNumBones       != inst->mNumBones      ||
                        orig->mNumFaces       != inst->mNumFaces      ||
                        orig->mNumVertices    != inst->mNumVertices   ||
                        orig->mMaterialIndex  != inst->mMaterialIndex ||
                        orig->mPrimitiveTypes != inst->mPrimitiveTypes)
                        continue;

                    // up to now the meshes are equal. Now compare vertex positions, normals,
                    // tangents and bitangents using this epsilon.
                    if (orig->HasPositions()) {
                        if(!CompareArrays(orig->mVertices,inst->mVertices,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasNormals()) {
                        if(!CompareArrays(orig->mNormals,inst->mNormals,orig->mNumVertices,epsilon))
                            continue;
                    }
                    if (orig->HasTangentsAndBitangents()) {
                        if (!CompareArrays(orig->mTangents,inst->mTangents,orig->mNumVertices,epsilon) ||
                            !CompareArrays(orig->mBitangents,inst->mBitangents,orig->mNumVertices,epsilon))
                            continue;
                    }

                    // use a constant epsilon for colors and UV coordinates
                    static const float uvEpsilon = 10e-4f;
                    {
                        unsigned int j, end = orig->GetNumUVChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mTextureCoords[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mTextureCoords[j],inst->mTextureCoords[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }
                    {
                        unsigned int j, end = orig->GetNumColorChannels();
                        for(j = 0; j < end; ++j) {
                            if (!orig->mColors[j]) {
                                continue;
                            }
                            if(!CompareArrays(orig->mColors[j],inst->mColors[j],orig->mNumVertices,uvEpsilon)) {
                                break;
                            }
                        }
                        if (j != end) {
                            continue;
                        }
                    }

                    // These two checks are actually quite expensive and almost *never* required.
                    // Almost. That's why they're still here. But there's no reason to do them
                    // in speed-targeted imports.
                    if (!configSpeedFlag) {

                        // It seems to be strange, but we really need to check whether the
                        // bones are identical too. Although it's extremely unprobable
                        // that they're not if control reaches here, we need to deal
                        // with unprobable cases, too. It could still be that there are
                        // equal shapes which are deformed differently.
                        if (!CompareBones(orig,inst))
                            continue;

                        // For completeness ... compare even the index buffers for equality
                        // face order & winding order doesn't care. Input data is in verbose format.
                        std::unique_ptr<unsigned int[]> ftbl_orig(new unsigned int[orig->mNumVertices]);
                        std::unique_ptr<unsigned int[]> ftbl_inst(new unsigned int[orig->mNumVertices]);

                        for (unsigned int tt = 0; tt < orig->mNumFaces;++tt) {
                            aiFace& f = orig->mFaces[tt];
                            for (unsigned int nn = 0; nn < f.mNumIndices;++nn)
                                ftbl_orig[f.mIndices[nn]] = tt;

                            aiFace& f2 = inst->mFaces[tt];
                            for (unsigned int nn = 0; nn < f2.mNumIndices;++nn)
                                ftbl_inst[f2.mIndices[nn]] = tt;
                        }
                        if (0 != ::memcmp(ftbl_inst.get(),ftbl_orig.get(),orig->mNumVertices*sizeof(unsigned int)))
                            continue;
                    }

                    // We're still here. Or in other words: 'inst' is an instance of 'orig'.
                    // Place a marker in our list that we can easily update mesh indices.
                    remapping[i] = remapping[a];

                    // Delete the instanced mesh, we don't need it anymore
                    delete inst;
                    pScene->mMeshes[i] = NULL;
                    break;
                }
            }

            // If we didn't find a match for the current mesh: keep it
            if (pScene->mMeshes[i]) {
                remapping[i] = numMeshesOut++;
            }
        }
        ai_assert(0 != numMeshesOut);
        if (numMeshesOut != pScene->mNumMeshes) {

            // Collapse the meshes array by removing all NULL entries
            for (unsigned int real = 0, i = 0; real < numMeshesOut; ++i) {
                if (pScene->mMeshes[i])
                    pScene->mMeshes[real++] = pScene->mMeshes[i];
            }

            // And update the node graph with our nice lookup table
            UpdateMeshIndices(pScene->mRootNode,remapping.get());

            // write to log
            if (!DefaultLogger::isNullLogger()) {
                ASSIMP_LOG_INFO_F( "FindInstancesProcess finished. Found ", (pScene->mNumMeshes - numMeshesOut), " instances" );
            }
            pScene->mNumMeshes = numMeshesOut;
        } else {
            ASSIMP_LOG_DEBUG("FindInstancesProcess finished. No instanced meshes found");
        }
    }
}